

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::UsingDeclaration::UsingDeclaration
          (UsingDeclaration *this,Context *c,Identifier usingName,
          pool_ptr<soul::AST::Expression> *target)

{
  bool bVar1;
  pool_ptr<soul::AST::Expression> local_18;
  
  TypeDeclarationBase::TypeDeclarationBase
            (&this->super_TypeDeclarationBase,UsingDeclaration,c,usingName);
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject._vptr_ASTObject
       = (_func_int **)&PTR__UsingDeclaration_002f7da0;
  local_18 = (pool_ptr<soul::AST::Expression>)target->object;
  (this->targetType).object = local_18.object;
  if (local_18.object != (Expression *)0x0) {
    bVar1 = isPossiblyType(&local_18);
    if (!bVar1) {
      throwInternalCompilerError
                ("targetType == nullptr || isPossiblyType (targetType)","UsingDeclaration",0x5ad);
    }
  }
  return;
}

Assistant:

UsingDeclaration (const Context& c, Identifier usingName, pool_ptr<Expression> target)
            : TypeDeclarationBase (ObjectType::UsingDeclaration, c, usingName), targetType (target)
        {
            SOUL_ASSERT (targetType == nullptr || isPossiblyType (targetType));
        }